

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O2

void __thiscall
EDCircles::DetectArcs(EDCircles *this,vector<LineSegment,_std::allocator<LineSegment>_> *lines)

{
  Info *pIVar1;
  pointer pLVar2;
  BufferManager *pBVar3;
  double *pdVar4;
  double *pdVar5;
  pointer pvVar6;
  int iVar7;
  int iVar8;
  bool bVar9;
  double r_00;
  bool bVar10;
  int m;
  double dVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  double *y;
  int iVar15;
  double *pdVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  int iVar20;
  long lVar21;
  int iVar22;
  int *piVar23;
  double *pdVar24;
  long lVar25;
  ulong uVar26;
  EDCircles *pEVar27;
  EDCircles *this_00;
  bool *pbVar28;
  int iVar29;
  long lVar30;
  long lVar31;
  undefined1 *puVar32;
  double dVar33;
  double dVar34;
  double ellipseFitError;
  double dVar35;
  double in_XMM6_Qa;
  ulong local_158;
  ulong local_150;
  int local_140;
  int local_118;
  double eTheta;
  double local_108;
  double local_100;
  double local_f8;
  EDCircles *local_f0;
  long local_e8;
  double eTheta_1;
  int local_d8;
  int local_d4;
  double local_d0;
  double yc;
  double xc;
  int *local_b8;
  double yc_1;
  double xc_1;
  double Error;
  uint local_94;
  double circleFitError;
  double radius;
  long local_80;
  double error;
  double r;
  double sTheta;
  
  iVar20 = (this->super_EDPF).super_ED.width;
  local_d4 = (this->super_EDPF).super_ED.height;
  if (local_d4 < iVar20) {
    local_d4 = iVar20;
  }
  local_d4 = local_d4 / 5;
  local_b8 = &this->noCircles1;
  dVar33 = 1.0471975511965976;
  local_d8 = 1;
  local_f0 = this;
  do {
    if (local_d8 == 3) {
      return;
    }
    dVar11 = 1.6534698176788385;
    if (local_d8 != 2) {
      dVar11 = dVar33;
    }
    dVar33 = dVar11;
    local_80 = 0;
    local_100 = dVar33;
    while (lVar13 = local_80, lVar13 < (this->super_EDPF).super_ED.segmentNos) {
      uVar17 = this->segmentStartLines[lVar13];
      local_158 = (ulong)uVar17;
      local_80 = lVar13 + 1;
      iVar20 = this->segmentStartLines[lVar13 + 1];
      if (1 < (int)(iVar20 - uVar17)) {
        uVar18 = (long)iVar20 - 1;
LAB_00109fe5:
        local_118 = (int)uVar18;
        iVar20 = (int)local_158;
        if (iVar20 < local_118) {
          local_150 = local_158 & 0xffffffff;
          pIVar1 = this->info;
          lVar30 = (long)iVar20;
          if (pIVar1[lVar30].taken == true) {
LAB_0010a0b3:
            local_158 = (ulong)(iVar20 + 1);
            goto LAB_00109fe5;
          }
          pLVar2 = (lines->super__Vector_base<LineSegment,_std::allocator<LineSegment>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          iVar15 = pLVar2[lVar30].len;
          if (local_d4 <= iVar15) goto LAB_0010a0b3;
          dVar11 = pIVar1[lVar30].angle;
          uVar17 = iVar20 + 1;
          local_158 = (ulong)uVar17;
          if ((0.10471975511965977 <= dVar11) && (local_158 = (ulong)uVar17, dVar11 <= dVar33)) {
            piVar23 = &pLVar2[lVar30 + 1].len;
            pbVar28 = &pIVar1[lVar30 + 1].taken;
            lVar21 = lVar30;
            local_158 = local_150;
            do {
              lVar21 = lVar21 + 1;
              uVar26 = uVar18;
              if ((long)uVar18 <= lVar21) break;
              if (((*pbVar28 != false) || (((Info *)(pbVar28 + -0x10))->sign != pIVar1[lVar30].sign)
                  ) || (local_d4 <= *piVar23)) {
                uVar26 = (ulong)((int)local_158 + 1);
                break;
              }
              pdVar16 = (double *)(pbVar28 + -8);
              local_158 = (ulong)((int)local_158 + 1);
              uVar26 = local_158;
              if (*pdVar16 < 0.10471975511965977) break;
              piVar23 = piVar23 + 0x12;
              pbVar28 = pbVar28 + 0x18;
            } while (*pdVar16 <= dVar33);
            local_158 = uVar26;
            iVar22 = (int)local_158;
            pdVar16 = (double *)0x0;
            local_d0 = 0.0;
            bVar9 = false;
            if (iVar22 - iVar20 == 1) {
              if (0.2617993877991494 <= dVar11) {
                iVar29 = pLVar2[(int)uVar17].len;
                iVar7 = iVar15;
                if (iVar29 < iVar15) {
                  iVar7 = iVar29;
                }
                iVar8 = iVar15;
                if (iVar15 < iVar29) {
                  iVar8 = iVar29;
                }
                if (((0.7853981633974483 < dVar11) || (iVar29 + iVar15 < 0x28)) ||
                   (iVar7 * 2 < iVar8)) goto LAB_0010a0fe;
                local_d0 = 0.0;
              }
              else {
LAB_0010a0fe:
                if (((iVar20 != this->segmentStartLines[lVar13]) ||
                    (pIVar1[uVar18].angle < 0.10471975511965977)) || (dVar33 < pIVar1[uVar18].angle)
                   ) {
                  if (((iVar22 == local_118) && (0.10471975511965977 <= pIVar1[uVar18].angle)) &&
                     (pIVar1[uVar18].angle <= dVar33)) {
                    local_d0 = 0.0;
                    bVar9 = true;
                    goto LAB_0010a1cd;
                  }
                  goto LAB_00109fe5;
                }
                local_d0 = 4.94065645841247e-324;
              }
              bVar9 = false;
            }
LAB_0010a1cd:
            local_f8 = (double)CONCAT44(local_f8._4_4_,iVar22 - iVar20);
            pBVar3 = this->bm;
            pdVar4 = pBVar3->x;
            pdVar5 = pBVar3->y;
            iVar20 = pBVar3->index;
            this_00 = (EDCircles *)(pdVar4 + iVar20);
            y = pdVar5 + iVar20;
            if (SUB81(local_d0,0) != '\0') {
              iVar15 = pLVar2[uVar18].firstPixelIndex;
              pvVar6 = (this->super_EDPF).super_ED.segmentPoints.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar17 = pLVar2[uVar18].len;
              if (pLVar2[uVar18].len < 1) {
                uVar17 = 0;
              }
              pdVar16 = (double *)(ulong)uVar17;
              for (pdVar24 = (double *)0x0; pdVar16 != pdVar24;
                  pdVar24 = (double *)((long)pdVar24 + 1)) {
                lVar21 = *(long *)&pvVar6[lVar13].
                                   super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                   ._M_impl.super__Vector_impl_data + (long)iVar15 * 8 + 4;
                *(double *)(&(this_00->super_EDPF).super_ED.width + (long)pdVar24 * 2) =
                     (double)*(int *)(lVar21 + -4 + (long)pdVar24 * 8);
                y[(long)pdVar24] = (double)*(int *)(lVar21 + (long)pdVar24 * 8);
              }
            }
            local_e8 = (long)iVar22;
            lVar21 = lVar30;
            while( true ) {
              iVar15 = (int)pdVar16;
              lVar25 = (long)iVar15;
              if (local_e8 < lVar21) break;
              iVar29 = pLVar2[lVar21].firstPixelIndex;
              pvVar6 = (this->super_EDPF).super_ED.segmentPoints.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar17 = pLVar2[lVar21].len;
              if (pLVar2[lVar21].len < 1) {
                uVar17 = 0;
              }
              for (uVar26 = 0; uVar17 != uVar26; uVar26 = uVar26 + 1) {
                lVar14 = *(long *)&pvVar6[lVar13].
                                   super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                   ._M_impl.super__Vector_impl_data + (long)iVar29 * 8 + 4;
                pdVar4[(long)iVar20 + lVar25 + uVar26] = (double)*(int *)(lVar14 + -4 + uVar26 * 8);
                pdVar5[(long)iVar20 + lVar25 + uVar26] = (double)*(int *)(lVar14 + uVar26 * 8);
              }
              pdVar16 = (double *)(ulong)(uint)(iVar15 + (int)uVar26);
              lVar21 = lVar21 + 1;
              this = local_f0;
            }
            if (bVar9) {
              iVar29 = pLVar2[this->segmentStartLines[lVar13]].firstPixelIndex;
              pvVar6 = (this->super_EDPF).super_ED.segmentPoints.
                       super__Vector_base<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>,_std::allocator<std::vector<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar26 = (ulong)(uint)pLVar2[this->segmentStartLines[lVar13]].len;
              if (pLVar2[this->segmentStartLines[lVar13]].len < 1) {
                uVar26 = 0;
              }
              for (uVar19 = 0; uVar26 != uVar19; uVar19 = uVar19 + 1) {
                lVar21 = *(long *)&pvVar6[lVar13].
                                   super__Vector_base<cv::Point_<int>,_std::allocator<cv::Point_<int>_>_>
                                   ._M_impl.super__Vector_impl_data + (long)iVar29 * 8 + 4;
                pdVar4[(long)iVar20 + lVar25 + uVar19] = (double)*(int *)(lVar21 + -4 + uVar19 * 8);
                pdVar5[(long)iVar20 + lVar25 + uVar19] = (double)*(int *)(lVar21 + uVar19 * 8);
              }
              pdVar16 = (double *)(ulong)(uint)(iVar15 + (int)uVar19);
            }
            iVar15 = (int)pdVar16;
            pBVar3->index = iVar20 + iVar15;
            CircleFit((double *)this_00,y,iVar15,&xc,&yc,&radius,&circleFitError);
            r_00 = radius;
            dVar11 = xc;
            dVar33 = yc;
            dVar34 = (double)iVar15 / (radius * 6.283185307179586);
            if ((local_f8._0_4_ != 1) || (0.0625 <= dVar34)) {
              iVar20 = (int)lVar13;
              if (circleFitError <= *(double *)(&DAT_001183a0 + (ulong)(2 < local_f8._0_4_) * 8)) {
                if (local_d0._0_1_ == '\0') {
                  if (bVar9) {
                    pdVar16 = (double *)
                              (ulong)(uint)(iVar15 - (lines->
                                                  super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [this->segmentStartLines[lVar13]].len);
                  }
                }
                else {
                  iVar22 = (lines->super__Vector_base<LineSegment,_std::allocator<LineSegment>_>).
                           _M_impl.super__Vector_impl_data._M_start[uVar18].len;
                  this_00 = (EDCircles *)(&(this_00->super_EDPF).super_ED.width + (long)iVar22 * 2);
                  y = y + iVar22;
                  pdVar16 = (double *)(ulong)(uint)(iVar15 - iVar22);
                }
                iVar15 = (int)pdVar16;
                if ((dVar34 < 0.67) || (1.5 < circleFitError)) {
                  local_108 = circleFitError;
                  ComputeStartAndEndAngles(xc,yc,radius,(double *)this_00,y,iVar15,&sTheta,&eTheta);
                  addArc(this->edarcs1->arcs,&this->edarcs1->noArcs,dVar11,dVar33,r_00,local_108,
                         sTheta,eTheta,this->info[lVar30].sign,iVar20,
                         (int)*(double *)&(this_00->super_EDPF).super_ED,(int)*y,
                         (int)*(double *)((long)this_00 + (long)iVar15 * 8 + -8),
                         (int)y[(long)iVar15 + -1],(double *)this_00,y,iVar15,in_XMM6_Qa);
                }
                else {
                  addCircle(this->circles1,local_b8,xc,yc,radius,circleFitError,(double *)this_00,y,
                            iVar15);
                }
                pbVar28 = &this->info[lVar30].taken;
                for (; dVar33 = local_100, lVar30 < local_e8; lVar30 = lVar30 + 1) {
                  *pbVar28 = true;
                  pbVar28 = pbVar28 + 0x18;
                }
                goto LAB_00109fe5;
              }
              dVar33 = *(double *)&(this_00->super_EDPF).super_ED -
                       *(double *)((long)this_00 + (long)iVar15 * 8 + -8);
              uVar17 = -(uint)(0.67 <= dVar34 &&
                              SQRT(dVar33 * dVar33 +
                                   (*y - y[(long)iVar15 + -1]) * (*y - y[(long)iVar15 + -1])) <=
                              radius * 1.72);
              if (((uVar17 & 1) != 0) || (local_d8 == 1 && 0.25 <= dVar34)) {
                local_108 = circleFitError;
                pEVar27 = this_00;
                local_94 = uVar17;
                EllipseEquation::EllipseEquation((EllipseEquation *)&sTheta);
                uVar17 = local_94;
                bVar10 = EllipseFit(this_00,y,pdVar16,(int)&sTheta,(EllipseEquation *)0x1,
                                    (int)pEVar27);
                dVar33 = local_d0;
                if (bVar10) {
                  ellipseFitError =
                       ComputeEllipseError((EllipseEquation *)&sTheta,(double *)this_00,y,iVar15);
                  dVar34 = xc;
                  dVar11 = yc;
                  dVar35 = 1.5;
                  if ((uVar17 & 1) == 0) {
                    dVar35 = 0.75;
                  }
                  if (ellipseFitError <= dVar35) {
                    if (SUB81(dVar33,0) == '\0') {
                      if (bVar9) {
                        pdVar16 = (double *)
                                  (ulong)(uint)(iVar15 - (lines->
                                                  super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                                  )._M_impl.super__Vector_impl_data._M_start
                                                  [this->segmentStartLines[lVar13]].len);
                      }
                    }
                    else {
                      iVar22 = (lines->super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                               )._M_impl.super__Vector_impl_data._M_start[uVar18].len;
                      this_00 = (EDCircles *)
                                (&(this_00->super_EDPF).super_ED.width + (long)iVar22 * 2);
                      y = y + iVar22;
                      pdVar16 = (double *)(ulong)(uint)(iVar15 - iVar22);
                    }
                    iVar15 = (int)pdVar16;
                    if ((uVar17 & 1) == 0) {
                      ComputeStartAndEndAngles
                                (xc,yc,r_00,(double *)this_00,y,iVar15,&eTheta,&eTheta_1);
                      addArc(this->edarcs1->arcs,&this->edarcs1->noArcs,dVar34,dVar11,r_00,local_108
                             ,eTheta,eTheta_1,this->info[lVar30].sign,iVar20,
                             (EllipseEquation *)&sTheta,ellipseFitError,
                             (int)*(double *)&(this_00->super_EDPF).super_ED,(int)*y,
                             (int)*(double *)((long)this_00 + (long)iVar15 * 8 + -8),
                             (int)y[(long)iVar15 + -1],(double *)this_00,y,iVar15,0.0);
                    }
                    else {
                      addCircle(this->circles1,local_b8,xc,yc,r_00,local_108,
                                (EllipseEquation *)&sTheta,ellipseFitError,(double *)this_00,y,
                                iVar15);
                      ellipseFitError = in_XMM6_Qa;
                    }
                    pbVar28 = &this->info[lVar30].taken;
                    for (; dVar33 = local_100, in_XMM6_Qa = ellipseFitError, lVar30 < local_e8;
                        lVar30 = lVar30 + 1) {
                      *pbVar28 = true;
                      pbVar28 = pbVar28 + 0x18;
                    }
                    goto LAB_00109fe5;
                  }
                }
              }
              if (local_f8._0_4_ == 1) {
                this->info[lVar30].taken = true;
                dVar33 = local_100;
              }
              else {
                while (iVar15 = (int)local_150, dVar33 = local_100, iVar15 <= iVar22 + -2) {
                  Error = 10000000000.0;
                  lVar21 = (long)iVar15;
                  lVar14 = (long)(iVar15 + 2);
                  dVar11 = (double)(lVar21 * 0x48 + 0x40);
                  lVar31 = lVar21 * 0x18 + 0x10;
                  uVar17 = iVar15 + 3;
                  lVar25 = lVar14 * 0x18 + 0x28;
                  lVar30 = lVar14 * 0x48 + 0x88;
                  while( true ) {
                    this = local_f0;
                    dVar33 = local_100;
                    if (local_e8 < lVar14) goto LAB_00109fe5;
                    iVar15 = 0;
                    dVar33 = dVar11;
                    for (lVar12 = lVar21; lVar12 <= lVar14; lVar12 = lVar12 + 1) {
                      iVar15 = iVar15 + *(int *)((long)&((lines->
                                                  super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                                  )._M_impl.super__Vector_impl_data._M_start)->a +
                                                (long)dVar33);
                      dVar33 = (double)((long)dVar33 + 0x48);
                    }
                    local_f8 = dVar11;
                    CircleFit((double *)this_00,y,iVar15,&sTheta,&eTheta,&eTheta_1,&Error);
                    if (Error <= 1.0) break;
                    lVar12 = (long)(lines->
                                   super__Vector_base<LineSegment,_std::allocator<LineSegment>_>).
                                   _M_impl.super__Vector_impl_data._M_start[lVar21].len;
                    this_00 = (EDCircles *)(&(this_00->super_EDPF).super_ED.width + lVar12 * 2);
                    y = y + lVar12;
                    lVar21 = lVar21 + 1;
                    lVar14 = lVar14 + 1;
                    dVar11 = (double)((long)local_f8 + 0x48);
                    lVar31 = lVar31 + 0x18;
                    uVar17 = uVar17 + 1;
                    lVar25 = lVar25 + 0x18;
                    lVar30 = lVar30 + 0x48;
                  }
                  puVar32 = (undefined1 *)((long)&local_f0->info->sign + lVar31);
                  for (lVar31 = lVar21; lVar31 <= (int)lVar14; lVar31 = lVar31 + 1) {
                    *puVar32 = 1;
                    puVar32 = puVar32 + 0x18;
                  }
                  for (; dVar33 = Error, local_150 = (ulong)uVar17, lVar14 < local_e8;
                      lVar14 = lVar14 + 1) {
                    iVar29 = *(int *)((long)&((lines->
                                              super__Vector_base<LineSegment,_std::allocator<LineSegment>_>
                                              )._M_impl.super__Vector_impl_data._M_start)->a +
                                     lVar30) + iVar15;
                    CircleFit((double *)this_00,y,iVar29,&xc_1,&yc_1,&r,&error);
                    if (1.5 < error) break;
                    sTheta = xc_1;
                    eTheta = yc_1;
                    eTheta_1 = r;
                    *(undefined1 *)((long)&local_f0->info->sign + lVar25) = 1;
                    uVar17 = uVar17 + 1;
                    lVar25 = lVar25 + 0x18;
                    lVar30 = lVar30 + 0x48;
                    Error = error;
                    iVar15 = iVar29;
                  }
                  this = local_f0;
                  lVar30 = (long)iVar15;
                  if (((double)iVar15 / (radius * 6.283185307179586) < 0.67) ||
                     (1.5 < circleFitError)) {
                    local_f8 = sTheta;
                    local_d0 = eTheta;
                    local_108 = eTheta_1;
                    ComputeStartAndEndAngles
                              (sTheta,eTheta,eTheta_1,(double *)this_00,y,iVar15,&xc_1,&yc_1);
                    this = local_f0;
                    local_140 = (int)lVar21;
                    addArc(local_f0->edarcs1->arcs,&local_f0->edarcs1->noArcs,local_f8,local_d0,
                           local_108,dVar33,xc_1,yc_1,local_f0->info[local_140].sign,iVar20,
                           (int)*(double *)&(this_00->super_EDPF).super_ED,(int)*y,
                           (int)*(double *)((long)this_00 + lVar30 * 8 + -8),(int)y[lVar30 + -1],
                           (double *)this_00,y,iVar15,in_XMM6_Qa);
                  }
                  else {
                    addCircle(local_f0->circles1,local_b8,sTheta,eTheta,eTheta_1,dVar33,
                              (double *)this_00,y,iVar15);
                  }
                  this_00 = (EDCircles *)(&(this_00->super_EDPF).super_ED.width + lVar30 * 2);
                  y = y + lVar30;
                }
              }
              goto LAB_00109fe5;
            }
            this->info[lVar30].taken = true;
            dVar33 = local_100;
          }
          goto LAB_00109fe5;
        }
      }
    }
    local_d8 = local_d8 + 1;
  } while( true );
}

Assistant:

void EDCircles::DetectArcs(vector<LineSegment> lines)
{

	double maxLineLengthThreshold = MAX(width, height) / 5;

	double MIN_ANGLE = PI / 30;  // 6 degrees
	double MAX_ANGLE = PI / 3;   // 60 degrees

	for (int iter = 1; iter <= 2; iter++) {
		if (iter == 2) MAX_ANGLE = PI / 1.9;  // 95 degrees
											  //    if (iter == 2) MAX_ANGLE = PI/2.25;  // 80 degrees

		for (int curSegmentNo = 0; curSegmentNo<segmentNos; curSegmentNo++) {
			int firstLine = segmentStartLines[curSegmentNo];
			int stopLine = segmentStartLines[curSegmentNo + 1];

			// We need at least 2 line segments
			if (stopLine - firstLine <= 1) continue;

			// Process the info for the lines of this segment
			while (firstLine < stopLine - 1) {
				// If the line is already taken during the previous step, continue
				if (info[firstLine].taken) { firstLine++; continue; }

				// very long lines cannot be part of an arc
				if (lines[firstLine].len >= maxLineLengthThreshold) { firstLine++; continue; }

				// Skip lines that cannot be part of an arc
				if (info[firstLine].angle < MIN_ANGLE || info[firstLine].angle > MAX_ANGLE) { firstLine++; continue; }

				// Find a group of lines (at least 3) with the same sign & angle < MAX_ANGLE degrees
				int lastLine = firstLine + 1;
				while (lastLine < stopLine - 1) {
					if (info[lastLine].taken) break;
					if (info[lastLine].sign != info[firstLine].sign) break;

					if (lines[lastLine].len >= maxLineLengthThreshold) break; // very long lines cannot be part of an arc
					if (info[lastLine].angle < MIN_ANGLE) break;
					if (info[lastLine].angle > MAX_ANGLE) break;

					lastLine++;
				} //end-while

				bool specialCase = false;
				int wrapCase = -1;  // 1: wrap the first two lines with the last line, 2: wrap the last two lines with the first line
#if 0
									// If we do not have 3 lines, then continue
				if (lastLine - firstLine <= 1) { firstLine = lastLine; continue; }
#else
									//        if (lastLine-firstLine == 0){firstLine=lastLine; continue;}
				if (lastLine - firstLine == 1) {
					// Just 2 lines. If long enough, then try to combine. Angle between 15 & 45 degrees. Min. length = 40
					int totalLineLength = lines[firstLine].len + lines[firstLine + 1].len;
					int shorterLen = lines[firstLine].len;
					int longerLen = lines[firstLine + 1].len;

					if (lines[firstLine + 1].len < shorterLen) {
						shorterLen = lines[firstLine + 1].len;
						longerLen = lines[firstLine].len;
					} //end-if

					if (info[firstLine].angle >= PI / 12 && info[firstLine].angle <= PI / 4 && totalLineLength >= 40 && shorterLen * 2 >= longerLen) {
						specialCase = true;
					} //end-if

					  // If the two lines do not make up for arc generation, then try to wrap the lines to the first OR last line.
					  // There are two wrapper cases: 
					if (specialCase == false) {
						// Case 1: Combine the first two lines with the last line of the segment
						if (firstLine == segmentStartLines[curSegmentNo] && info[stopLine - 1].angle >= MIN_ANGLE && info[stopLine - 1].angle <= MAX_ANGLE) {
							wrapCase = 1;
							specialCase = true;
						} //end-if            

						  // Case 2: Combine the last two lines with the first line of the segment
						else if (lastLine == stopLine - 1 && info[lastLine].angle >= MIN_ANGLE && info[lastLine].angle <= MAX_ANGLE) {
							wrapCase = 2;
							specialCase = true;
						} //end-if            
					} // end-if

					  // If still not enough for arc generation, then skip
					if (specialCase == false) {
						firstLine = lastLine;
						continue;
					} //end-else
				} //end-if
#endif

				  // Copy the pixels of this segment to an array
				int noPixels = 0;
				double *x = bm->getX();
				double *y = bm->getY();

				// wrapCase 1: Combine the first two lines with the last line of the segment
				if (wrapCase == 1) {
					int index = lines[stopLine - 1].firstPixelIndex;

					for (int n = 0; n<lines[stopLine - 1].len; n++) {
						x[noPixels] = segmentPoints[curSegmentNo][index + n].x;
						y[noPixels] = segmentPoints[curSegmentNo][index + n].y;
						noPixels++;
					} //end-for
				} //end-if

				for (int m = firstLine; m <= lastLine; m++) {
					int index = lines[m].firstPixelIndex;

					for (int n = 0; n<lines[m].len; n++) {
						x[noPixels] = segmentPoints[curSegmentNo][index + n].x;
						y[noPixels] = segmentPoints[curSegmentNo][index + n].y;
						noPixels++;
					} //end-for
				} //end-for

				  // wrapCase 2: Combine the last two lines with the first line of the segment
				if (wrapCase == 2) {
					int index = lines[segmentStartLines[curSegmentNo]].firstPixelIndex;

					for (int n = 0; n<lines[segmentStartLines[curSegmentNo]].len; n++) {
						x[noPixels] = segmentPoints[curSegmentNo][index + n].x;
						y[noPixels] = segmentPoints[curSegmentNo][index + n].y;
						noPixels++;
					} //end-for
				} //end-if

				  // Move buffer pointers
				bm->move(noPixels);

				// Try to fit a circle to the entire arc of lines
				double xc, yc, radius, circleFitError;
				CircleFit(x, y, noPixels, &xc, &yc, &radius, &circleFitError);

				double coverage = noPixels / (TWOPI*radius);

				// In the case of the special case, the arc must cover at least 22.5 degrees
				if (specialCase && coverage < 1.0 / 16) { info[firstLine].taken = true; firstLine = lastLine; continue; }

				// If only 3 lines, use the SHORT_ARC_ERROR
				double MYERROR = SHORT_ARC_ERROR;
				if (lastLine - firstLine >= 3) MYERROR = LONG_ARC_ERROR;
				if (circleFitError <= MYERROR) {
					// Add this to the list of arcs
					if (wrapCase == 1) {
						x += lines[stopLine - 1].len;
						y += lines[stopLine - 1].len;
						noPixels -= lines[stopLine - 1].len;

					}
					else if (wrapCase == 2) {
						noPixels -= lines[segmentStartLines[curSegmentNo]].len;
					} //end-else

					if ((coverage >= FULL_CIRCLE_RATIO && circleFitError <= LONG_ARC_ERROR)) {
						addCircle(circles1, noCircles1, xc, yc, radius, circleFitError, x, y, noPixels);

					}
					else {
						double sTheta, eTheta;
						ComputeStartAndEndAngles(xc, yc, radius, x, y, noPixels, &sTheta, &eTheta);

						addArc(edarcs1->arcs, edarcs1->noArcs, xc, yc, radius, circleFitError, sTheta, eTheta, info[firstLine].sign, curSegmentNo,
							(int)x[0], (int)y[0], (int)x[noPixels - 1], (int)y[noPixels - 1], x, y, noPixels);
					} //end-else

					for (int m = firstLine; m<lastLine; m++) info[m].taken = true;
					firstLine = lastLine;
					continue;
				} //end-if

				  // Check if this is an almost closed loop (i.e, if 60% of the circle is present). If so, try to fit an ellipse to the entire arc of lines
				double dx = x[0] - x[noPixels - 1];
				double dy = y[0] - y[noPixels - 1];
				double distanceBetweenEndPoints = sqrt(dx*dx + dy*dy);

				bool isAlmostClosedLoop = (distanceBetweenEndPoints <= 1.72*radius && coverage >= FULL_CIRCLE_RATIO);
				if (isAlmostClosedLoop || (iter == 1 && coverage >= 0.25)) {  // an arc covering at least 90 degrees
					EllipseEquation eq;
					double ellipseFitError = 1e10;

					bool valid = EllipseFit(x, y, noPixels, &eq);
					if (valid) ellipseFitError = ComputeEllipseError(&eq, x, y, noPixels);

					MYERROR = ELLIPSE_ERROR;
					if (isAlmostClosedLoop == false) MYERROR = 0.75;

					if (ellipseFitError <= MYERROR) {
						// Add this to the list of arcs
						if (wrapCase == 1) {
							x += lines[stopLine - 1].len;
							y += lines[stopLine - 1].len;
							noPixels -= lines[stopLine - 1].len;

						}
						else if (wrapCase == 2) {
							noPixels -= lines[segmentStartLines[curSegmentNo]].len;
						} //end-else

						if (isAlmostClosedLoop) {
							addCircle(circles1, noCircles1, xc, yc, radius, circleFitError, &eq, ellipseFitError, x, y, noPixels);  // Add an ellipse for validation

						}
						else {
							double sTheta, eTheta;
							ComputeStartAndEndAngles(xc, yc, radius, x, y, noPixels, &sTheta, &eTheta);

							addArc(edarcs1->arcs, edarcs1->noArcs,  xc, yc, radius, circleFitError, sTheta, eTheta, info[firstLine].sign, curSegmentNo, &eq, ellipseFitError,
								(int)x[0], (int)y[0], (int)x[noPixels - 1], (int)y[noPixels - 1], x, y, noPixels);
						} //end-else

						for (int m = firstLine; m<lastLine; m++) info[m].taken = true;
						firstLine = lastLine;
						continue;
					} //end-if
				} //end-if

				if (specialCase) { info[firstLine].taken = true; firstLine = lastLine; continue; }

				// Continue until we finish all lines that belong to arc of lines
				while (firstLine <= lastLine - 2) {
					// Fit an initial arc and extend it
					int curLine = firstLine + 2;

					// Fit a circle to the pixels of these lines and see if the error is less than a threshold
					double XC, YC, R, Error = 1e10;
					bool found = false;

					noPixels = 0;
					while (curLine <= lastLine) {
						noPixels = 0;
						for (int m = firstLine; m <= curLine; m++) noPixels += lines[m].len;

						// Fit circle
						CircleFit(x, y, noPixels, &XC, &YC, &R, &Error);
						if (Error <= SHORT_ARC_ERROR) { found = true; break; } // found if the error is smaller than the threshold

																			   // Not found. Move to the next set of lines
						x += lines[firstLine].len;
						y += lines[firstLine].len;

						firstLine++;
						curLine++;
					} //end-while

					  // If no initial arc found, then we are done with this arc of lines
					if (!found) break;

					// If we found an initial arc, then extend it
					for (int m = curLine - 2; m <= curLine; m++) info[m].taken = true;
					curLine++;
					while (curLine <= lastLine) {
						int index = lines[curLine].firstPixelIndex;
						int noPixelsSave = noPixels;

						noPixels += lines[curLine].len;

						double xc, yc, r, error;
						CircleFit(x, y, noPixels, &xc, &yc, &r, &error);
						if (error > LONG_ARC_ERROR) { noPixels = noPixelsSave; break; }   // Adding this line made the error big. So, we do not use this line

																						  // OK. Longer arc
						XC = xc;
						YC = yc;
						R = r;
						Error = error;

						info[curLine].taken = true;
						curLine++;
					} //end-while

					double coverage = noPixels / (TWOPI*radius);
					if ((coverage >= FULL_CIRCLE_RATIO && circleFitError <= LONG_ARC_ERROR)) {
						addCircle(circles1, noCircles1, XC, YC, R, Error, x, y, noPixels);

					}
					else {
						// Add this to the list of arcs
						double sTheta, eTheta;
						ComputeStartAndEndAngles(XC, YC, R, x, y, noPixels, &sTheta, &eTheta);

						addArc(edarcs1->arcs, edarcs1->noArcs, XC, YC, R, Error, sTheta, eTheta, info[firstLine].sign, curSegmentNo,
							(int)x[0], (int)y[0], (int)x[noPixels - 1], (int)y[noPixels - 1], x, y, noPixels);
					} //end-else

					x += noPixels;
					y += noPixels;

					firstLine = curLine;
				} //end-while-current-arc-of-lines

				firstLine = lastLine;
			} //end-while-entire-edge-segment
		} //end-for
	} //end-for-iter
}